

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TValue * rec_mm_concat_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint *puVar1;
  uint uVar2;
  jit_State *J;
  TRef *pTVar3;
  TRef *pTVar4;
  TValue TVar5;
  TValue TVar6;
  TValue TVar7;
  TRef TVar8;
  TRef TVar9;
  uint uVar10;
  TValue *pTVar11;
  uint *puVar12;
  uint slot;
  ulong uVar13;
  uint *puVar14;
  BCReg BVar15;
  long lVar16;
  RecordIndex ix;
  
  J = *(jit_State **)((long)ud + 0x28);
  uVar10 = *(uint *)((long)ud + 0x30);
  uVar2 = *(uint *)((long)ud + 0x34);
  pTVar3 = J->base;
  uVar13 = (ulong)uVar10;
  while (slot = (uint)uVar13, slot <= uVar2) {
    if (J->base[uVar13] == 0) {
      sload(J,slot);
    }
    uVar13 = (ulong)(slot + 1);
  }
  puVar1 = pTVar3 + uVar2;
  if ((((*puVar1 & 0x1f000000) == 0x4000000) || ((*puVar1 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar1[-1] & 0x1f000000) == 0x4000000 || ((puVar1[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar4 = J->base;
    lVar16 = -4 - (long)(pTVar3 + uVar2);
    for (puVar14 = puVar1; pTVar4 + uVar10 <= puVar14; puVar14 = puVar14 + -1) {
      uVar2 = *puVar14;
      if ((uVar2 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5b04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar2;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar2 & 0x1f000000) == 0xe000000);
        TVar8 = lj_opt_fold(J);
        *puVar14 = TVar8;
      }
      else if ((uVar2 & 0x1f000000) != 0x4000000) break;
      lVar16 = lVar16 + 4;
    }
    puVar14 = puVar14 + 1;
    TVar8 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x38);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x53050000;
    TVar9 = lj_opt_fold(J);
    puVar12 = puVar14;
    TVar8 = TVar9;
    do {
      uVar2 = *puVar12;
      puVar12 = puVar12 + 1;
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar2;
      TVar8 = lj_opt_fold(J);
    } while (puVar12 <= puVar1);
    (J->fold).ins.field_0.ot = 0x5504;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    ix.key = lj_opt_fold(J);
    BVar15 = (BCReg)((ulong)-(lVar16 + (long)J->base) >> 2);
    J->maxslot = BVar15;
    if (puVar14 == pTVar4 + uVar10) goto LAB_0013fbcd;
    uVar10 = BVar15 - 1;
    J->maxslot = uVar10;
    *(BCReg *)((long)ud + 0x34) = BVar15;
    pTVar11 = L->base;
    uVar13 = (ulong)(BVar15 - 1);
    *(TValue *)((long)ud + 0x20) = pTVar11[uVar13 + 4];
    TVar5 = pTVar11[uVar13];
    TVar6 = (pTVar11 + uVar13)[1];
    TVar7 = (pTVar11 + uVar13 + 2)[1];
    *(TValue *)((long)ud + 0x10) = pTVar11[uVar13 + 2];
    *(TValue *)((long)ud + 0x18) = TVar7;
    *(TValue *)ud = TVar5;
    *(TValue *)((long)ud + 8) = TVar6;
    *puVar14 = ix.key;
    ix.keyv.field_2.it = 0xfffffffb;
    ix.keyv.u32.lo = (int)J + -0x150;
    pTVar11 = J->L->base;
  }
  else {
    uVar10 = uVar2 - 1;
    J->maxslot = uVar10;
    pTVar11 = J->L->base;
    ix.keyv = pTVar11[uVar2];
    ix.key = *puVar1;
    puVar14 = puVar1;
  }
  ix.tabv = pTVar11[uVar10];
  ix.tab = puVar14[-1];
  rec_mm_arith(J,&ix,MM_concat);
  ix.key = 0;
LAB_0013fbcd:
  *(TRef *)((long)ud + 0x38) = ix.key;
  return (TValue *)0x0;
}

Assistant:

static TValue *rec_mm_concat_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  RecCatDataCP *rcd = (RecCatDataCP *)ud;
  jit_State *J = rcd->J;
  BCReg baseslot = rcd->baseslot, topslot = rcd->topslot;
  TRef *top = &J->base[topslot];
  BCReg s;
  RecordIndex ix;
  UNUSED(L); UNUSED(dummy);
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) {
      rcd->tr = tr;  /* Return simple concatenation result. */
      return NULL;
    }
    /* Pass partial result. */
    rcd->topslot = topslot = J->maxslot--;
    /* Save updated range of slots. */
    memcpy(rcd->savetv, &L->base[topslot-1], sizeof(rcd->savetv));
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  rcd->tr = 0;  /* No result yet. */
  return NULL;
}